

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall
backward::TraceResolverLinuxBase::~TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  pointer pcVar1;
  
  (this->super_TraceResolverImplBase)._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxBase_00186bd8;
  pcVar1 = (this->exec_path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->exec_path_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->argv0_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->argv0_).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_TraceResolverImplBase)._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverImplBase_00186c08;
  if ((this->super_TraceResolverImplBase)._demangler.
      super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._empty == false) {
    free((this->super_TraceResolverImplBase)._demangler.
         super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._val);
  }
  operator_delete(this);
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}